

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void AddArgsToScope(ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator,bool assignLocation)

{
  long lVar1;
  code *pcVar2;
  anon_class_32_4_343c1aa9 fn;
  anon_class_32_4_343c1aa9 fn_00;
  bool bVar3;
  byte bVar4;
  FuncInfo *pFVar5;
  undefined4 *puVar6;
  bool assignLocationSave;
  undefined1 local_40 [8];
  anon_class_32_4_343c1aa9 addArgToScope;
  bool isNonSimpleParameterList;
  ArgSlot pos;
  ByteCodeGenerator *pBStack_18;
  bool assignLocation_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeFnc *pnodeFnc_local;
  
  addArgToScope.assignLocation._7_1_ = assignLocation;
  pBStack_18 = byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)pnodeFnc;
  pFVar5 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  if (pFVar5->varRegsCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x901,"(byteCodeGenerator->TopFuncInfo()->varRegsCount == 0)",
                       "byteCodeGenerator->TopFuncInfo()->varRegsCount == 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  addArgToScope.assignLocation._4_2_ = 1;
  addArgToScope.assignLocation._3_1_ =
       ParseNodeFnc::HasNonSimpleParameterList((ParseNodeFnc *)byteCodeGenerator_local);
  local_40 = (undefined1  [8])&stack0xffffffffffffffe8;
  addArgToScope.byteCodeGenerator = (ByteCodeGenerator **)((long)&addArgToScope.assignLocation + 4);
  addArgToScope.pos = (ArgSlot *)((long)&addArgToScope.assignLocation + 3);
  addArgToScope.isNonSimpleParameterList = (bool *)((long)&addArgToScope.assignLocation + 7);
  fn.pos = (ArgSlot *)addArgToScope.byteCodeGenerator;
  fn.byteCodeGenerator = (ByteCodeGenerator **)local_40;
  fn.isNonSimpleParameterList = (bool *)addArgToScope.pos;
  fn.assignLocation = addArgToScope.isNonSimpleParameterList;
  MapFormalsWithoutRest<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
            ((ParseNodeFnc *)byteCodeGenerator_local,fn);
  ByteCodeGenerator::SetNumberOfInArgs(pBStack_18,addArgToScope.assignLocation._4_2_);
  lVar1._0_2_ = (byteCodeGenerator_local->m_writer).lastOpcode;
  lVar1._2_1_ = (byteCodeGenerator_local->m_writer).inEnsureLongBranch;
  lVar1._3_1_ = (byteCodeGenerator_local->m_writer).field_0x1b;
  lVar1._4_4_ = (byteCodeGenerator_local->m_writer).firstUnknownJumpInfo;
  if (lVar1 != 0) {
    bVar4 = addArgToScope.assignLocation._7_1_ & 1;
    addArgToScope.assignLocation._7_1_ = 1;
    AddArgsToScope::anon_class_32_4_343c1aa9::operator()
              ((anon_class_32_4_343c1aa9 *)local_40,
               *(ParseNode **)&(byteCodeGenerator_local->m_writer).lastOpcode);
    addArgToScope.assignLocation._7_1_ = bVar4;
  }
  fn_00.pos = (ArgSlot *)addArgToScope.byteCodeGenerator;
  fn_00.byteCodeGenerator = (ByteCodeGenerator **)local_40;
  fn_00.isNonSimpleParameterList = (bool *)addArgToScope.pos;
  fn_00.assignLocation = addArgToScope.isNonSimpleParameterList;
  MapFormalsFromPattern<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
            ((ParseNodeFnc *)byteCodeGenerator_local,fn_00);
  if ((addArgToScope.assignLocation._7_1_ & 1) != 0) {
    pFVar5 = ByteCodeGenerator::TopFuncInfo(pBStack_18);
    if (pFVar5->varRegsCount + 1 != (uint)addArgToScope.assignLocation._4_2_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x93b,
                         "(!assignLocation || byteCodeGenerator->TopFuncInfo()->varRegsCount + 1 == pos)"
                         ,
                         "!assignLocation || byteCodeGenerator->TopFuncInfo()->varRegsCount + 1 == pos"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  return;
}

Assistant:

void AddArgsToScope(ParseNodeFnc * pnodeFnc, ByteCodeGenerator *byteCodeGenerator, bool assignLocation)
{
    Assert(byteCodeGenerator->TopFuncInfo()->varRegsCount == 0);
    Js::ArgSlot pos = 1;
    bool isNonSimpleParameterList = pnodeFnc->HasNonSimpleParameterList();

    auto addArgToScope = [&](ParseNode *arg)
    {
        if (arg->IsVarLetOrConst())
        {
            ParseNodeVar * pnodeVarArg = arg->AsParseNodeVar();
            Symbol *formal = byteCodeGenerator->AddSymbolToScope(byteCodeGenerator->TopFuncInfo()->GetParamScope(),
                reinterpret_cast<const char16*>(pnodeVarArg->pid->Psz()),
                pnodeVarArg->pid->Cch(),
                pnodeVarArg,
                STFormal);
#if DBG_DUMP
            if (byteCodeGenerator->Trace())
            {
                Output::Print(_u("current context has declared arg %s of type %s at position %d\n"), arg->AsParseNodeVar()->pid->Psz(), formal->GetSymbolTypeName(), pos);
            }
#endif

            if (isNonSimpleParameterList)
            {
                formal->SetIsNonSimpleParameter(true);
            }

            pnodeVarArg->sym = formal;
            MarkFormal(byteCodeGenerator, formal, assignLocation || isNonSimpleParameterList, isNonSimpleParameterList);
        }
        else if (arg->nop == knopParamPattern)
        {
            arg->AsParseNodeParamPattern()->location = byteCodeGenerator->NextVarRegister();
        }
        else
        {
            Assert(false);
        }
        ArgSlotMath::Inc(pos);
    };

    // We process rest separately because the number of in args needs to exclude rest.
    MapFormalsWithoutRest(pnodeFnc, addArgToScope);
    byteCodeGenerator->SetNumberOfInArgs(pos);

    if (pnodeFnc->pnodeRest != nullptr)
    {
        // The rest parameter will always be in a register, regardless of whether it is in a scope slot.
        // We save the assignLocation value for the assert condition below.
        bool assignLocationSave = assignLocation;
        assignLocation = true;

        addArgToScope(pnodeFnc->pnodeRest);

        assignLocation = assignLocationSave;
    }

    MapFormalsFromPattern(pnodeFnc, addArgToScope);

    Assert(!assignLocation || byteCodeGenerator->TopFuncInfo()->varRegsCount + 1 == pos);
}